

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

upb_Message * upb_Message_New(upb_MiniTable *m,upb_Arena *a)

{
  upb_Message *puVar1;
  upb_Arena *a_local;
  upb_MiniTable *m_local;
  
  puVar1 = _upb_Message_New(m,a);
  return puVar1;
}

Assistant:

UPB_INLINE struct upb_Message* _upb_Message_New(const upb_MiniTable* m,
                                                upb_Arena* a) {
#ifdef UPB_TRACING_ENABLED
  upb_Message_LogNewMessage(m, a);
#endif  // UPB_TRACING_ENABLED

  const int size = m->UPB_PRIVATE(size);
  struct upb_Message* msg = (struct upb_Message*)upb_Arena_Malloc(a, size);
  if (UPB_UNLIKELY(!msg)) return NULL;
  memset(msg, 0, size);
  return msg;
}